

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char>::visit_bool
          (ArgFormatterBase<fmt::ArgFormatter<char>,_char> *this,bool value)

{
  size_t in_RCX;
  void *in_RDX;
  
  if (this->spec_->type_ != '\0') {
    visit_any_int<bool>(this,value);
    return;
  }
  write(this,(uint)value,in_RDX,in_RCX);
  return;
}

Assistant:

void visit_bool(bool value) {
    if (spec_.type_)
      return visit_any_int(value);
    write(value);
  }